

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O0

int minimalSwap(word *pInOut,word *pMinimal,word *PDuplicat,int nVars,char *pCanonPerm,
               char *tempArray,uint *p_uCanonPhase)

{
  int iVar1;
  int iVar2;
  uint local_50;
  uint TempuCanonPhase;
  int blockSizeChar;
  int blockSizeWord;
  int i;
  char *tempArray_local;
  char *pCanonPerm_local;
  int nVars_local;
  word *PDuplicat_local;
  word *pMinimal_local;
  word *pInOut_local;
  
  iVar1 = Kit_TruthWordNum_64bit(nVars);
  iVar1 = iVar1 << 3;
  local_50 = *p_uCanonPhase;
  memcpy(pMinimal,pInOut,(long)iVar1);
  memcpy(PDuplicat,pInOut,(long)iVar1);
  memcpy(tempArray,pCanonPerm,(long)nVars);
  Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,0);
  swapInfoAdjacentVars(0,pCanonPerm,p_uCanonPhase);
  for (blockSizeChar = 1; blockSizeChar < nVars + -1; blockSizeChar = blockSizeChar + 1) {
    iVar2 = memCompare(pMinimal,pInOut,nVars);
    if (iVar2 == 1) {
      memcpy(pMinimal,pInOut,(long)iVar1);
      memcpy(tempArray,pCanonPerm,(long)nVars);
      local_50 = *p_uCanonPhase;
    }
    else {
      memcpy(pInOut,pMinimal,(long)iVar1);
      memcpy(pCanonPerm,tempArray,(long)nVars);
      *p_uCanonPhase = local_50;
    }
    Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,blockSizeChar);
    swapInfoAdjacentVars(blockSizeChar,pCanonPerm,p_uCanonPhase);
  }
  iVar2 = memCompare(pMinimal,pInOut,nVars);
  if (iVar2 == -1) {
    memcpy(pInOut,pMinimal,(long)iVar1);
    memcpy(pCanonPerm,tempArray,(long)nVars);
    *p_uCanonPhase = local_50;
  }
  iVar1 = memcmp(pInOut,PDuplicat,(long)iVar1);
  pInOut_local._4_4_ = (uint)(iVar1 != 0);
  return pInOut_local._4_4_;
}

Assistant:

int minimalSwap(word* pInOut, word* pMinimal, word* PDuplicat, int  nVars, char * pCanonPerm, char * tempArray, unsigned* p_uCanonPhase) 
{
    int i;  
    int blockSizeWord = Kit_TruthWordNum_64bit( nVars )*sizeof(word);
    int blockSizeChar = nVars *sizeof(char);
    unsigned TempuCanonPhase = *p_uCanonPhase;
    memcpy(pMinimal, pInOut, (size_t)blockSizeWord);
    memcpy(PDuplicat, pInOut, (size_t)blockSizeWord);
    memcpy(tempArray, pCanonPerm, (size_t)blockSizeChar);  
    Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, 0 );
    swapInfoAdjacentVars(0, pCanonPerm, p_uCanonPhase);
    for(i=1;i<nVars-1;i++)
    {
        if( memCompare(pMinimal,pInOut,nVars) == 1)
        {
            memcpy(pMinimal, pInOut, (size_t)blockSizeWord);
            memcpy(tempArray, pCanonPerm, (size_t)blockSizeChar);
            TempuCanonPhase = *p_uCanonPhase;
            
        }
        else
        {
            memcpy(pInOut, pMinimal, (size_t)blockSizeWord);
            memcpy(pCanonPerm, tempArray, (size_t)blockSizeChar);
            *p_uCanonPhase = TempuCanonPhase;
        }
        Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, i );
        swapInfoAdjacentVars(i, pCanonPerm, p_uCanonPhase);
    }
    if( memCompare(pMinimal,pInOut,nVars) == -1)
    {
        memcpy(pInOut, pMinimal, (size_t)blockSizeWord);
        memcpy(pCanonPerm, tempArray, (size_t)blockSizeChar);
        *p_uCanonPhase = TempuCanonPhase;
    }
    if(memcmp(pInOut,PDuplicat,(size_t)blockSizeWord) == 0)
        return 0;
    else
        return 1;
}